

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.c
# Opt level: O1

int cmd_list(char *arg)

{
  int iVar1;
  undefined8 *__ptr;
  char *pcVar2;
  undefined8 *puVar3;
  char *__format;
  size_t __size;
  uint uVar4;
  undefined4 local_3c;
  undefined8 uStack_38;
  int option_index;
  
  __ptr = (undefined8 *)malloc(0x10);
  pcVar2 = strdup(arg);
  *__ptr = pcVar2;
  strtok(pcVar2," ");
  uStack_38 = 0;
  pcVar2 = strtok((char *)0x0," ");
  if (pcVar2 == (char *)0x0) {
    uVar4 = 1;
  }
  else {
    __size = 0x18;
    uVar4 = 1;
    do {
      puVar3 = (undefined8 *)realloc(__ptr,__size);
      if (puVar3 == (undefined8 *)0x0) {
        cmd_list_cold_1();
        goto LAB_00109882;
      }
      *(char **)((long)puVar3 + (__size - 0x10)) = pcVar2;
      pcVar2 = strtok((char *)0x0," ");
      __size = __size + 8;
      uVar4 = uVar4 + 1;
      __ptr = puVar3;
    } while (pcVar2 != (char *)0x0);
  }
  __ptr[uVar4] = 0;
  _optind = 0;
  do {
    while( true ) {
      local_3c = 0;
      iVar1 = getopt_long(uVar4,__ptr,"hf:",cmd_list::long_options,&local_3c);
      pcVar2 = _optarg;
      if (iVar1 < 0x66) break;
      if (iVar1 == 0x66) {
        iVar1 = strcmp(_optarg,"xml");
        uStack_38 = 1;
        if (iVar1 != 0) {
          iVar1 = strcmp(pcVar2,"json");
          uStack_38 = 2;
          if (iVar1 != 0) {
            __format = "Unknown output format \"%s\".\n";
LAB_00109878:
            fprintf(_stderr,__format,pcVar2);
            goto LAB_00109882;
          }
        }
      }
      else if (iVar1 == 0x68) {
        cmd_data_help();
        free((void *)*__ptr);
        free(__ptr);
        return 0;
      }
    }
    if (iVar1 == -1) {
      if (_optind == uVar4) {
        free((void *)*__ptr);
        free(__ptr);
        iVar1 = print_list(_stdout,ctx,(LYD_FORMAT)uStack_38);
        return iVar1;
      }
      pcVar2 = (char *)__ptr[(int)_optind];
      __format = "Unknown parameter \"%s\"\n";
      goto LAB_00109878;
    }
  } while (iVar1 != 0x3f);
LAB_00109882:
  free((void *)*__ptr);
  free(__ptr);
  return 1;
}

Assistant:

int
cmd_list(const char *arg)
{
    char **argv = NULL, *ptr;
    int c, argc, option_index;
    LYD_FORMAT outformat = LYD_UNKNOWN;
    static struct option long_options[] = {
        {"help", no_argument, 0, 'h'},
        {"format", required_argument, 0, 'f'},
        {NULL, 0, 0, 0}
    };
    void *rlcd;

    argc = 1;
    argv = malloc(2*sizeof *argv);
    *argv = strdup(arg);
    ptr = strtok(*argv, " ");
    while ((ptr = strtok(NULL, " "))) {
        rlcd = realloc(argv, (argc+2)*sizeof *argv);
        if (!rlcd) {
            fprintf(stderr, "Memory allocation failed (%s:%d, %s)", __FILE__, __LINE__, strerror(errno));
            goto error;
        }
        argv = rlcd;
        argv[argc++] = ptr;
    }
    argv[argc] = NULL;

    optind = 0;
    while (1) {
        option_index = 0;
        c = getopt_long(argc, argv, "hf:", long_options, &option_index);
        if (c == -1) {
            break;
        }

        switch (c) {
        case 'h':
            cmd_data_help();
            free(*argv);
            free(argv);
            return 0;
        case 'f':
            if (!strcmp(optarg, "xml")) {
                outformat = LYD_XML;
            } else if (!strcmp(optarg, "json")) {
                outformat = LYD_JSON;
            } else {
                fprintf(stderr, "Unknown output format \"%s\".\n", optarg);
                goto error;
            }
            break;
        case '?':
            /* getopt_long() prints message */
            goto error;
        }
    }
    if (optind != argc) {
        fprintf(stderr, "Unknown parameter \"%s\"\n", argv[optind]);
error:
        free(*argv);
        free(argv);
        return 1;
    }
    free(*argv);
    free(argv);

    return print_list(stdout, ctx, outformat);
}